

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWCommon.cxx
# Opt level: O2

void __thiscall cmCPackIFWCommon::WriteGeneratedByToStrim(cmCPackIFWCommon *this,cmXMLWriter *xout)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_1d2;
  cmTimestamp local_1d1;
  string local_1d0;
  string local_1b0;
  ostringstream comment;
  
  if (this->Generator != (cmCPackIFWGenerator *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
    poVar2 = std::operator<<((ostream *)&comment,"Generated by CPack ");
    poVar2 = std::operator<<(poVar2,"3.29.20240330-ge5f7ff8");
    poVar2 = std::operator<<(poVar2," IFW generator ");
    std::operator<<(poVar2,"for QtIFW ");
    bVar1 = IsVersionEqual(this,"1.9.9");
    if (bVar1) {
      std::operator<<((ostream *)&comment,"less 2.0");
    }
    else {
      std::operator<<((ostream *)&comment,(string *)&this->Generator->FrameworkVersion);
    }
    poVar2 = std::operator<<((ostream *)&comment," tools at ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1d2);
    cmTimestamp::CurrentTime(&local_1d0,&local_1d1,&local_1b0,true);
    std::operator<<(poVar2,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::stringbuf::str();
    cmXMLWriter::Comment(xout,local_1d0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  }
  return;
}

Assistant:

void cmCPackIFWCommon::WriteGeneratedByToStrim(cmXMLWriter& xout) const
{
  if (!this->Generator) {
    return;
  }

  std::ostringstream comment;
  comment << "Generated by CPack " << CMake_VERSION << " IFW generator "
          << "for QtIFW ";
  if (this->IsVersionEqual("1.9.9")) {
    comment << "less 2.0";
  } else {
    comment << this->Generator->FrameworkVersion;
  }
  comment << " tools at " << cmTimestamp().CurrentTime("", true);
  xout.Comment(comment.str().c_str());
}